

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

int yylex(void)

{
  bool bVar1;
  bool local_11;
  int local_10;
  int local_c;
  int token;
  
  if (((lexerState->atLineStart & 1U) != 0) && (lexerStateEOL != (LexerState *)0x0)) {
    lexer_SetState(lexerStateEOL);
    lexerStateEOL = (LexerState *)0x0;
  }
  if ((lexerState->lastToken == 0xd2) && (bVar1 = yywrap(), bVar1)) {
    local_c = 0;
  }
  else {
    if (((lexerState->atLineStart & 1U) != 0) && (lexerState->expansions == (Expansion *)0x0)) {
      nextLine();
    }
    local_10 = (*yylex::lexerModeFuncs[lexerState->mode])();
    if ((local_10 == 0) && ((lexerState->capturing & 1U) == 0)) {
      local_10 = 0xd2;
    }
    lexerState->lastToken = local_10;
    local_11 = local_10 == 0xd || local_10 == 0xd2;
    lexerState->atLineStart = local_11;
    local_c = local_10;
  }
  return local_c;
}

Assistant:

int yylex(void)
{
	if (lexerState->atLineStart && lexerStateEOL) {
		lexer_SetState(lexerStateEOL);
		lexerStateEOL = NULL;
	}
	// `lexer_SetState` updates `lexerState`, so check for EOF after it
	if (lexerState->lastToken == T_EOB && yywrap())
		return T_EOF;
	// Newlines read within an expansion should not increase the line count
	if (lexerState->atLineStart && !lexerState->expansions)
		nextLine();

	static int (* const lexerModeFuncs[])(void) = {
		AT(LEXER_NORMAL)       yylex_NORMAL,
		AT(LEXER_RAW)          yylex_RAW,
		AT(LEXER_SKIP_TO_ELIF) yylex_SKIP_TO_ELIF,
		AT(LEXER_SKIP_TO_ENDC) yylex_SKIP_TO_ENDC,
		AT(LEXER_SKIP_TO_ENDR) yylex_SKIP_TO_ENDR,
	};
	int token = lexerModeFuncs[lexerState->mode]();

	// Captures end at their buffer's boundary no matter what
	if (token == T_EOF && !lexerState->capturing)
		token = T_EOB;
	lexerState->lastToken = token;
	lexerState->atLineStart = token == T_NEWLINE || token == T_EOB;

	return token;
}